

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O1

int Fra_FraigInductionTest(char *pFileName,Fra_Ssw_t *pParams)

{
  void *pvVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Man_t *pManAig;
  Aig_Man_t *p;
  char *__filename;
  FILE *__stream;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  
  pManAig = Saig_ManReadBlif(pFileName);
  if (pManAig == (Aig_Man_t *)0x0) {
    iVar6 = 0;
  }
  else {
    p = Fra_FraigInduction(pManAig,pParams);
    if (p == (Aig_Man_t *)0x0) {
      iVar6 = 0;
    }
    else {
      if (pParams->fVerbose != 0) {
        printf("Original AIG: ");
        Aig_ManPrintStats(pManAig);
        printf("Reduced  AIG: ");
        Aig_ManPrintStats(p);
      }
      Aig_ManStop(p);
      pvVar1 = pManAig->pData;
      __filename = Aig_FileNameGenericAppend(pFileName,".pairs");
      __stream = fopen(__filename,"w");
      pVVar4 = pManAig->vObjs;
      if (pVVar4->nSize < 1) {
        uVar5 = 0;
      }
      else {
        lVar7 = 0;
        uVar5 = 0;
        do {
          pvVar2 = pVVar4->pArray[lVar7];
          if (pvVar2 != (void *)0x0) {
            pAVar3 = pManAig->pReprs[*(int *)((long)pvVar2 + 0x24)];
            if (pAVar3 != (Aig_Obj_t *)0x0) {
              fprintf(__stream,"%d %d %c\n",
                      (ulong)*(uint *)((long)pvVar1 + (long)*(int *)((long)pvVar2 + 0x24) * 4),
                      (ulong)*(uint *)((long)pvVar1 + (long)pAVar3->Id * 4),
                      (ulong)((((*(uint *)&pAVar3->field_0x18 ^ *(uint *)((long)pvVar2 + 0x18)) & 8)
                              >> 2) + 0x2b));
              uVar5 = uVar5 + 1;
            }
          }
          lVar7 = lVar7 + 1;
          pVVar4 = pManAig->vObjs;
        } while (lVar7 < pVVar4->nSize);
      }
      fclose(__stream);
      iVar6 = 1;
      if (pParams->fVerbose != 0) {
        printf("Result: %d pairs of seq equiv nodes are written into file \"%s\".\n",(ulong)uVar5,
               __filename);
      }
    }
    Aig_ManStop(pManAig);
  }
  return iVar6;
}

Assistant:

int Fra_FraigInductionTest( char * pFileName, Fra_Ssw_t * pParams )
{
    FILE * pFile;
    char * pFilePairs;
    Aig_Man_t * pMan, * pNew;
    Aig_Obj_t * pObj, * pRepr;
    int * pNum2Id;
    int i, Counter = 0;
    pMan = Saig_ManReadBlif( pFileName );
    if ( pMan == NULL )
        return 0;
    // perform seq SAT sweeping
    pNew = Fra_FraigInduction( pMan, pParams );
    if ( pNew == NULL )
    {
        Aig_ManStop( pMan );
        return 0;
    }
    if ( pParams->fVerbose )
    {
        printf( "Original AIG: " );
        Aig_ManPrintStats( pMan );
        printf( "Reduced  AIG: " );
        Aig_ManPrintStats( pNew );
    }
    Aig_ManStop( pNew );
    pNum2Id = (int *)pMan->pData;
    // write the output file
    pFilePairs = Aig_FileNameGenericAppend( pFileName, ".pairs" );
    pFile = fopen( pFilePairs, "w" );
    Aig_ManForEachObj( pMan, pObj, i )
        if ( (pRepr = pMan->pReprs[pObj->Id]) )
        {
            fprintf( pFile, "%d %d %c\n", pNum2Id[pObj->Id], pNum2Id[pRepr->Id], (Aig_ObjPhase(pObj) ^ Aig_ObjPhase(pRepr))? '-' : '+' );
            Counter++;
        }
    fclose( pFile );
    if ( pParams->fVerbose )
    {
        printf( "Result: %d pairs of seq equiv nodes are written into file \"%s\".\n", Counter, pFilePairs );
    }
    Aig_ManStop( pMan );
    return 1;
}